

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile(lys_module *mod,lys_depset_unres *unres)

{
  lys_module *plVar1;
  lysp_submodule *plVar2;
  lysc_module *module;
  ulong local_1238;
  void *local_1228;
  lysp_ext_instance *local_1210;
  lysp_ext_instance *local_1200;
  lysp_ext_instance *local_11e8;
  lysp_ext_instance *local_11d8;
  void *local_11b8;
  void *local_11b0;
  ulong local_11a8;
  void *local_1198;
  lysp_ext_instance *local_1180;
  lysp_ext_instance *local_1170;
  lysp_ext_instance *local_1158;
  lysp_ext_instance *local_1148;
  void *local_1128;
  void *local_1120;
  long *local_1118;
  char *p___1;
  uint64_t __u_1;
  char *p__;
  uint64_t __u;
  ulong uStack_10f0;
  LY_ERR ret;
  uint64_t u;
  lysp_node_grp *grp;
  lysp_node *pnode;
  lysp_submodule *submod;
  lysp_module *sp;
  lysc_module *mod_c;
  lysc_ctx ctx;
  lys_depset_unres *unres_local;
  lys_module *mod_local;
  
  ctx._4248_8_ = unres;
  memset(&mod_c,0,0x10a0);
  if (mod == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","mod","lys_compile");
    return LY_EINVAL;
  }
  if (mod->parsed == (lysp_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","mod->parsed",
           "lys_compile");
    return LY_EINVAL;
  }
  if (mod->compiled != (lysc_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","!mod->compiled",
           "lys_compile");
    return LY_EINVAL;
  }
  if (mod->ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","mod->ctx","lys_compile");
    return LY_EINVAL;
  }
  if ((mod->implemented == '\0') || (mod->to_compile == '\0')) {
    __assert_fail("mod->implemented && mod->to_compile",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x6b2,"LY_ERR lys_compile(struct lys_module *, struct lys_depset_unres *)");
  }
  plVar1 = (lys_module *)mod->parsed;
  mod_c = (lysc_module *)(plVar1->ctx->dict).hash_tab;
  ctx.ctx = plVar1->ctx;
  ctx.pmod = (lysp_module *)0x0;
  ctx.unres._0_4_ = 1;
  ctx.free_ctx.ext_set.field_2._0_1_ = 0x2f;
  ctx._136_8_ = (plVar1->ctx->dict).hash_tab;
  ctx.uses_rfns.field_2 = (anon_union_8_3_0df1e6ad_for_ly_set_2)ctx._4248_8_;
  mod->ctx->change_count = mod->ctx->change_count + 1;
  ctx.cur_mod = plVar1;
  module = (lysc_module *)calloc(1,0x28);
  mod->compiled = module;
  if (module == (lysc_module *)0x0) {
    ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile");
    return LY_EMEM;
  }
  module->mod = mod;
  __u._4_4_ = lys_precompile_own_augments((lysc_ctx *)&mod_c);
  if ((__u._4_4_ == LY_SUCCESS) &&
     (__u._4_4_ = lys_precompile_own_deviations((lysc_ctx *)&mod_c), __u._4_4_ == LY_SUCCESS)) {
    for (grp = (lysp_node_grp *)plVar1->ref; grp != (lysp_node_grp *)0x0;
        grp = (grp->field_0).field_1.next) {
      __u._4_4_ = lys_compile_node((lysc_ctx *)&mod_c,(lysp_node *)grp,(lysc_node *)0x0,0,
                                   (ly_set *)0x0);
      if (__u._4_4_ != LY_SUCCESS) goto LAB_00163991;
    }
    for (grp = (lysp_node_grp *)plVar1->compiled; grp != (lysp_node_grp *)0x0;
        grp = (grp->field_0).field_1.next) {
      __u._4_4_ = lys_compile_node((lysc_ctx *)&mod_c,(lysp_node *)grp,(lysc_node *)0x0,0,
                                   (ly_set *)0x0);
      if (__u._4_4_ != LY_SUCCESS) goto LAB_00163991;
    }
    for (grp = (lysp_node_grp *)plVar1->identities; grp != (lysp_node_grp *)0x0;
        grp = (grp->field_0).field_1.next) {
      __u._4_4_ = lys_compile_node((lysc_ctx *)&mod_c,(lysp_node *)grp,(lysc_node *)0x0,0,
                                   (ly_set *)0x0);
      if (__u._4_4_ != LY_SUCCESS) goto LAB_00163991;
    }
    if ((lysp_ext_instance *)plVar1->deviated_by == (lysp_ext_instance *)0x0) {
LAB_00163052:
      uStack_10f0 = 0;
      do {
        if ((lysp_include *)plVar1->ns == (lysp_include *)0x0) {
          local_11a8 = 0;
        }
        else {
          local_11a8 = *(ulong *)(((lysp_include *)plVar1->ns)[-1].rev + 8);
        }
        if (local_11a8 <= uStack_10f0) {
          ctx.unres._4_4_ = ctx.unres._4_4_ | 1;
          u = (uint64_t)plVar1->dsc;
          ctx.cur_mod = plVar1;
          goto LAB_00163688;
        }
        plVar2 = ((lysp_include *)plVar1->ns)[uStack_10f0].submodule;
        ctx.cur_mod = (lys_module *)plVar2;
        for (grp = (lysp_node_grp *)plVar2->data; grp != (lysp_node_grp *)0x0;
            grp = (grp->field_0).field_1.next) {
          __u._4_4_ = lys_compile_node((lysc_ctx *)&mod_c,(lysp_node *)grp,(lysc_node *)0x0,0,
                                       (ly_set *)0x0);
          if (__u._4_4_ != LY_SUCCESS) goto LAB_00163991;
        }
        for (grp = (lysp_node_grp *)plVar2->rpcs; grp != (lysp_node_grp *)0x0;
            grp = (grp->field_0).field_1.next) {
          __u._4_4_ = lys_compile_node((lysc_ctx *)&mod_c,(lysp_node *)grp,(lysc_node *)0x0,0,
                                       (ly_set *)0x0);
          if (__u._4_4_ != LY_SUCCESS) goto LAB_00163991;
        }
        for (grp = (lysp_node_grp *)plVar2->notifs; grp != (lysp_node_grp *)0x0;
            grp = (grp->field_0).field_1.next) {
          __u._4_4_ = lys_compile_node((lysc_ctx *)&mod_c,(lysp_node *)grp,(lysc_node *)0x0,0,
                                       (ly_set *)0x0);
          if (__u._4_4_ != LY_SUCCESS) goto LAB_00163991;
        }
        if (plVar2->exts != (lysp_ext_instance *)0x0) {
          if (module->exts == (lysc_ext_instance *)0x0) {
            local_11b8 = (void *)0x0;
          }
          else {
            if (module->exts == (lysc_ext_instance *)0x0) {
              local_11b0 = (void *)0x0;
            }
            else {
              local_11b0 = module->exts[-1].compiled;
            }
            local_11b8 = local_11b0;
          }
          if (module->exts == (lysc_ext_instance *)0x0) {
            if (plVar2->exts == (lysp_ext_instance *)0x0) {
              local_11e8 = (lysp_ext_instance *)0x0;
            }
            else {
              local_11e8 = plVar2->exts[-1].exts;
            }
            local_1118 = (long *)calloc(1,((long)local_11b8 + (long)local_11e8) * 0x48 + 8);
            if (local_1118 == (long *)0x0) {
              ly_log((ly_ctx *)mod_c,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_compile");
              __u._4_4_ = LY_EMEM;
              goto LAB_00163991;
            }
          }
          else {
            if (plVar2->exts == (lysp_ext_instance *)0x0) {
              local_11d8 = (lysp_ext_instance *)0x0;
            }
            else {
              local_11d8 = plVar2->exts[-1].exts;
            }
            local_1118 = (long *)realloc(&module->exts[-1].compiled,
                                         ((long)module->exts[-1].compiled +
                                         (long)local_11b8 + (long)local_11d8) * 0x48 + 8);
            if (local_1118 == (long *)0x0) {
              ly_log((ly_ctx *)mod_c,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_compile");
              __u._4_4_ = LY_EMEM;
              goto LAB_00163991;
            }
          }
          module->exts = (lysc_ext_instance *)(local_1118 + 1);
          if (module->exts != (lysc_ext_instance *)0x0) {
            if (plVar2->exts == (lysp_ext_instance *)0x0) {
              local_1200 = (lysp_ext_instance *)0x0;
            }
            else {
              local_1200 = plVar2->exts[-1].exts;
            }
            memset(module->exts + *local_1118,0,((long)local_11b8 + (long)local_1200) * 0x48);
          }
          p___1 = (char *)0x0;
          while( true ) {
            if (plVar2->exts == (lysp_ext_instance *)0x0) {
              local_1210 = (lysp_ext_instance *)0x0;
            }
            else {
              local_1210 = plVar2->exts[-1].exts;
            }
            if (local_1210 <= p___1) break;
            module->exts[-1].compiled = (void *)((long)module->exts[-1].compiled + 1);
            if (module->exts == (lysc_ext_instance *)0x0) {
              local_1228 = (void *)0x0;
            }
            else {
              local_1228 = module->exts[-1].compiled;
            }
            __u._4_4_ = lys_compile_ext((lysc_ctx *)&mod_c,plVar2->exts + (long)p___1,
                                        module->exts + (long)local_1228 + -1,module);
            if (__u._4_4_ == LY_ENOT) {
              module->exts[-1].compiled = (void *)((long)module->exts[-1].compiled + -1);
            }
            else if (__u._4_4_ != LY_SUCCESS) goto LAB_00163991;
            p___1 = p___1 + 1;
          }
        }
        uStack_10f0 = uStack_10f0 + 1;
      } while( true );
    }
    if (module->exts == (lysc_ext_instance *)0x0) {
      local_1128 = (void *)0x0;
    }
    else {
      if (module->exts == (lysc_ext_instance *)0x0) {
        local_1120 = (void *)0x0;
      }
      else {
        local_1120 = module->exts[-1].compiled;
      }
      local_1128 = local_1120;
    }
    if (module->exts == (lysc_ext_instance *)0x0) {
      if ((lysp_ext_instance *)plVar1->deviated_by == (lysp_ext_instance *)0x0) {
        local_1158 = (lysp_ext_instance *)0x0;
      }
      else {
        local_1158 = ((lysp_ext_instance *)plVar1->deviated_by)[-1].exts;
      }
      __u_1 = (uint64_t)calloc(1,((long)local_1128 + (long)local_1158) * 0x48 + 8);
      if ((void *)__u_1 != (void *)0x0) goto LAB_00162e31;
      ly_log((ly_ctx *)mod_c,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile");
      __u._4_4_ = LY_EMEM;
    }
    else {
      if ((lysp_ext_instance *)plVar1->deviated_by == (lysp_ext_instance *)0x0) {
        local_1148 = (lysp_ext_instance *)0x0;
      }
      else {
        local_1148 = ((lysp_ext_instance *)plVar1->deviated_by)[-1].exts;
      }
      __u_1 = (uint64_t)
              realloc(&module->exts[-1].compiled,
                      ((long)module->exts[-1].compiled + (long)local_1128 + (long)local_1148) * 0x48
                      + 8);
      if ((void *)__u_1 != (void *)0x0) {
LAB_00162e31:
        module->exts = (lysc_ext_instance *)(__u_1 + 8);
        if (module->exts != (lysc_ext_instance *)0x0) {
          if ((lysp_ext_instance *)plVar1->deviated_by == (lysp_ext_instance *)0x0) {
            local_1170 = (lysp_ext_instance *)0x0;
          }
          else {
            local_1170 = ((lysp_ext_instance *)plVar1->deviated_by)[-1].exts;
          }
          memset(module->exts + *(long *)__u_1,0,((long)local_1128 + (long)local_1170) * 0x48);
        }
        p__ = (char *)0x0;
        do {
          if ((lysp_ext_instance *)plVar1->deviated_by == (lysp_ext_instance *)0x0) {
            local_1180 = (lysp_ext_instance *)0x0;
          }
          else {
            local_1180 = ((lysp_ext_instance *)plVar1->deviated_by)[-1].exts;
          }
          if (local_1180 <= p__) goto LAB_00163052;
          module->exts[-1].compiled = (void *)((long)module->exts[-1].compiled + 1);
          if (module->exts == (lysc_ext_instance *)0x0) {
            local_1198 = (void *)0x0;
          }
          else {
            local_1198 = module->exts[-1].compiled;
          }
          __u._4_4_ = lys_compile_ext((lysc_ctx *)&mod_c,
                                      (lysp_ext_instance *)plVar1->deviated_by + (long)p__,
                                      module->exts + (long)local_1198 + -1,module);
          if (__u._4_4_ == LY_ENOT) {
            module->exts[-1].compiled = (void *)((long)module->exts[-1].compiled + -1);
          }
          else if (__u._4_4_ != LY_SUCCESS) goto LAB_00163991;
          p__ = p__ + 1;
        } while( true );
      }
      ly_log((ly_ctx *)mod_c,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile");
      __u._4_4_ = LY_EMEM;
    }
  }
  goto LAB_00163991;
LAB_00163688:
  if (u == 0) goto LAB_001636e6;
  if (((*(ushort *)(u + 10) & 0x400) == 0) &&
     (__u._4_4_ = lys_compile_grouping((lysc_ctx *)&mod_c,(lysp_node *)0x0,(lysp_node_grp *)u),
     __u._4_4_ != LY_SUCCESS)) goto LAB_00163991;
  u = *(uint64_t *)(u + 0x10);
  goto LAB_00163688;
LAB_001636e6:
  for (grp = (lysp_node_grp *)plVar1->ref; grp != (lysp_node_grp *)0x0;
      grp = (grp->field_0).field_1.next) {
    for (u = (uint64_t)lysp_node_groupings((lysp_node *)grp); u != 0; u = *(uint64_t *)(u + 0x10)) {
      if (((*(ushort *)(u + 10) & 0x400) == 0) &&
         (__u._4_4_ = lys_compile_grouping((lysc_ctx *)&mod_c,(lysp_node *)grp,(lysp_node_grp *)u),
         __u._4_4_ != LY_SUCCESS)) goto LAB_00163991;
    }
  }
  uStack_10f0 = 0;
  while( true ) {
    if ((lysp_include *)plVar1->ns == (lysp_include *)0x0) {
      local_1238 = 0;
    }
    else {
      local_1238 = *(ulong *)(((lysp_include *)plVar1->ns)[-1].rev + 8);
    }
    if (local_1238 <= uStack_10f0) break;
    plVar2 = ((lysp_include *)plVar1->ns)[uStack_10f0].submodule;
    ctx.cur_mod = (lys_module *)plVar2;
    for (u = (uint64_t)plVar2->groupings; u != 0; u = *(uint64_t *)(u + 0x10)) {
      if (((*(ushort *)(u + 10) & 0x400) == 0) &&
         (__u._4_4_ = lys_compile_grouping((lysc_ctx *)&mod_c,(lysp_node *)0x0,(lysp_node_grp *)u),
         __u._4_4_ != LY_SUCCESS)) goto LAB_00163991;
    }
    for (grp = (lysp_node_grp *)plVar2->data; grp != (lysp_node_grp *)0x0;
        grp = (grp->field_0).field_1.next) {
      for (u = (uint64_t)lysp_node_groupings((lysp_node *)grp); u != 0; u = *(uint64_t *)(u + 0x10))
      {
        if (((*(ushort *)(u + 10) & 0x400) == 0) &&
           (__u._4_4_ = lys_compile_grouping((lysc_ctx *)&mod_c,(lysp_node *)grp,(lysp_node_grp *)u)
           , __u._4_4_ != LY_SUCCESS)) goto LAB_00163991;
      }
    }
    uStack_10f0 = uStack_10f0 + 1;
  }
  ctx.cur_mod = plVar1;
  ly_log_location_revert(0,0,1,0);
  __u._4_4_ = lys_compile_unres_mod((lysc_ctx *)&mod_c);
LAB_00163991:
  ly_log_location_revert(0,0,1,0);
  lys_compile_unres_mod_erase((lysc_ctx *)&mod_c,(ly_bool)__u._4_4_);
  if (__u._4_4_ != LY_SUCCESS) {
    lysc_module_free((lysf_ctx *)&ctx.path_len,module);
    mod->compiled = (lysc_module *)0x0;
  }
  return __u._4_4_;
}

Assistant:

LY_ERR
lys_compile(struct lys_module *mod, struct lys_depset_unres *unres)
{
    struct lysc_ctx ctx = {0};
    struct lysc_module *mod_c = NULL;
    struct lysp_module *sp;
    struct lysp_submodule *submod;
    struct lysp_node *pnode;
    struct lysp_node_grp *grp;
    LY_ARRAY_COUNT_TYPE u;
    LY_ERR ret = LY_SUCCESS;

    LY_CHECK_ARG_RET(NULL, mod, mod->parsed, !mod->compiled, mod->ctx, LY_EINVAL);

    assert(mod->implemented && mod->to_compile);

    sp = mod->parsed;
    LYSC_CTX_INIT_PMOD(ctx, sp, NULL);
    ctx.unres = unres;

    ++mod->ctx->change_count;
    mod->compiled = mod_c = calloc(1, sizeof *mod_c);
    LY_CHECK_ERR_RET(!mod_c, LOGMEM(mod->ctx), LY_EMEM);
    mod_c->mod = mod;

    /* compile augments and deviations of our module from other modules so they can be applied during compilation */
    LY_CHECK_GOTO(ret = lys_precompile_own_augments(&ctx), cleanup);
    LY_CHECK_GOTO(ret = lys_precompile_own_deviations(&ctx), cleanup);

    /* data nodes */
    LY_LIST_FOR(sp->data, pnode) {
        LY_CHECK_GOTO(ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL), cleanup);
    }

    /* top-level RPCs */
    LY_LIST_FOR((struct lysp_node *)sp->rpcs, pnode) {
        LY_CHECK_GOTO(ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL), cleanup);
    }

    /* top-level notifications */
    LY_LIST_FOR((struct lysp_node *)sp->notifs, pnode) {
        LY_CHECK_GOTO(ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL), cleanup);
    }

    /* module extension instances */
    COMPILE_EXTS_GOTO(&ctx, sp->exts, mod_c->exts, mod_c, ret, cleanup);

    /* the same for submodules */
    LY_ARRAY_FOR(sp->includes, u) {
        submod = sp->includes[u].submodule;
        ctx.pmod = (struct lysp_module *)submod;

        LY_LIST_FOR(submod->data, pnode) {
            ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }

        LY_LIST_FOR((struct lysp_node *)submod->rpcs, pnode) {
            ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }

        LY_LIST_FOR((struct lysp_node *)submod->notifs, pnode) {
            ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }

        COMPILE_EXTS_GOTO(&ctx, submod->exts, mod_c->exts, mod_c, ret, cleanup);
    }
    ctx.pmod = sp;

    /* validate non-instantiated groupings from the parsed schema,
     * without it we would accept even the schemas with invalid grouping specification */
    ctx.compile_opts |= LYS_COMPILE_GROUPING;
    LY_LIST_FOR(sp->groupings, grp) {
        if (!(grp->flags & LYS_USED_GRP)) {
            LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, NULL, grp), cleanup);
        }
    }
    LY_LIST_FOR(sp->data, pnode) {
        LY_LIST_FOR((struct lysp_node_grp *)lysp_node_groupings(pnode), grp) {
            if (!(grp->flags & LYS_USED_GRP)) {
                LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, pnode, grp), cleanup);
            }
        }
    }
    LY_ARRAY_FOR(sp->includes, u) {
        submod = sp->includes[u].submodule;
        ctx.pmod = (struct lysp_module *)submod;

        LY_LIST_FOR(submod->groupings, grp) {
            if (!(grp->flags & LYS_USED_GRP)) {
                LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, NULL, grp), cleanup);
            }
        }
        LY_LIST_FOR(submod->data, pnode) {
            LY_LIST_FOR((struct lysp_node_grp *)lysp_node_groupings(pnode), grp) {
                if (!(grp->flags & LYS_USED_GRP)) {
                    LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, pnode, grp), cleanup);
                }
            }
        }
    }
    ctx.pmod = sp;

    ly_log_location_revert(0, 0, 1, 0);

    /* finish compilation for all unresolved module items in the context */
    LY_CHECK_GOTO(ret = lys_compile_unres_mod(&ctx), cleanup);

cleanup:
    ly_log_location_revert(0, 0, 1, 0);
    lys_compile_unres_mod_erase(&ctx, ret);
    if (ret) {
        lysc_module_free(&ctx.free_ctx, mod_c);
        mod->compiled = NULL;
    }
    return ret;
}